

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh_ngon.cpp
# Opt level: O2

uint __thiscall ON_MeshNgon::BoundaryEdgeCount(ON_MeshNgon *this,ON_MeshFaceList *mesh_face_list)

{
  ON_2udex *pOVar1;
  ON_2udex *pOVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  ulong nel;
  uint face_vi [4];
  ON_SimpleArray<ON_2udex> edge_buffer;
  
  uVar5 = 0;
  if (((this->m_Fcount != 0) && (uVar5 = 0, this->m_fi != (uint *)0x0)) &&
     (mesh_face_list->m_face_count != 0)) {
    uVar5 = mesh_face_list->m_face_count * 4;
    ON_SimpleArray<ON_2udex>::ON_SimpleArray(&edge_buffer,(ulong)uVar5);
    if ((-1 < (int)uVar5) && ((int)uVar5 <= edge_buffer.m_capacity)) {
      edge_buffer.m_count = uVar5;
    }
    uVar7 = 0;
    for (uVar6 = 0; nel = (ulong)uVar7, uVar6 < this->m_Fcount; uVar6 = uVar6 + 1) {
      ON_MeshFaceList::QuadFvi(mesh_face_list,this->m_fi[uVar6],face_vi);
      if (face_vi[3] != face_vi[0]) {
        uVar5 = face_vi[0];
        if (face_vi[3] < face_vi[0]) {
          uVar5 = face_vi[3];
        }
        uVar4 = face_vi[3];
        if (face_vi[3] < face_vi[0] || face_vi[3] == face_vi[0]) {
          uVar4 = face_vi[0];
        }
        edge_buffer.m_a[nel].i = uVar5;
        edge_buffer.m_a[nel].j = uVar4;
        uVar7 = uVar7 + 1;
      }
      if (face_vi[0] != face_vi[1]) {
        uVar5 = face_vi[1];
        if (face_vi[0] < face_vi[1]) {
          uVar5 = face_vi[0];
        }
        uVar4 = face_vi[0];
        if (face_vi[0] < face_vi[1] || face_vi[0] == face_vi[1]) {
          uVar4 = face_vi[1];
        }
        edge_buffer.m_a[uVar7].i = uVar5;
        edge_buffer.m_a[uVar7].j = uVar4;
        uVar7 = uVar7 + 1;
      }
      if (face_vi[1] != face_vi[2]) {
        uVar5 = face_vi[2];
        if (face_vi[1] < face_vi[2]) {
          uVar5 = face_vi[1];
        }
        uVar4 = face_vi[1];
        if (face_vi[1] < face_vi[2] || face_vi[1] == face_vi[2]) {
          uVar4 = face_vi[2];
        }
        edge_buffer.m_a[uVar7].i = uVar5;
        edge_buffer.m_a[uVar7].j = uVar4;
        uVar7 = uVar7 + 1;
      }
      if (face_vi[2] != face_vi[3]) {
        uVar5 = face_vi[3];
        if (face_vi[2] < face_vi[3]) {
          uVar5 = face_vi[2];
        }
        uVar4 = face_vi[3];
        if (face_vi[2] >= face_vi[3] && face_vi[2] != face_vi[3]) {
          uVar4 = face_vi[2];
        }
        edge_buffer.m_a[uVar7].i = uVar5;
        edge_buffer.m_a[uVar7].j = uVar4;
        uVar7 = uVar7 + 1;
      }
    }
    ON_qsort(edge_buffer.m_a,nel,8,Internal_compare_ngon_edges);
    uVar5 = 0;
    uVar4 = 0;
    while (uVar4 < uVar7) {
      uVar6 = (ulong)uVar4;
      uVar3 = uVar4 + 1;
      pOVar1 = edge_buffer.m_a + uVar6;
      pOVar2 = edge_buffer.m_a + uVar6;
      while (uVar6 = uVar6 + 1, (uint)uVar6 < uVar7) {
        if ((edge_buffer.m_a[uVar6].i != pOVar1->i) || (edge_buffer.m_a[uVar6].j != pOVar2->j))
        goto LAB_005375a1;
      }
      uVar6 = (ulong)uVar7;
LAB_005375a1:
      uVar4 = (uint)uVar6;
      uVar5 = uVar5 + (uVar3 == uVar4);
    }
    ON_SimpleArray<ON_2udex>::~ON_SimpleArray(&edge_buffer);
  }
  return uVar5;
}

Assistant:

unsigned int ON_MeshNgon::BoundaryEdgeCount(const ON_MeshFaceList & mesh_face_list) const
{
  if (m_Fcount <= 0 || nullptr == m_fi)
    return 0;
  const unsigned int mesh_face_count = mesh_face_list.FaceCount();
  if (mesh_face_count <= 0)
    return 0;

  const unsigned int edge_capacity = 4 * mesh_face_count;
  ON_SimpleArray<ON_2udex> edge_buffer(edge_capacity);
  edge_buffer.SetCount(edge_capacity);
  ON_2udex* edges = edge_buffer.Array();
  unsigned int edge_count = 0;
  unsigned int face_vi[4];

  ON_2udex e;
  for (unsigned int i = 0; i < m_Fcount; i++)
  {
    mesh_face_list.QuadFvi(m_fi[i], face_vi);
    e.j = face_vi[3];
    for (unsigned int j = 0; j < 4; j++)
    {
      e.i = e.j;
      e.j = face_vi[j];
      if (e.i == e.j)
        continue;
      if (e.i < e.j)
      {
        edges[edge_count] = e;
      }
      else
      {
        edges[edge_count].i = e.j;
        edges[edge_count].j = e.i;
      }
      edge_count++;
    }
  }

  ON_qsort(edges, edge_count, sizeof(edges[0]), Internal_compare_ngon_edges);
  unsigned int boundary_edge_count = 0;

  for (unsigned int i = 0; i < edge_count; /*empty iterator*/)
  {
    e = edges[i++];
    const unsigned int i1 = i;
    for (/*empty init*/; i < edge_count; i++)
    {
      if (edges[i].i != e.i || edges[i].j != e.j)
        break;
    }
    if (i1 == i)
      boundary_edge_count++;
  }

  return boundary_edge_count;
}